

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to1.h
# Opt level: O3

void ncnn::conv3x3s1_winograd63_pack8to1_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  uint _c;
  int iVar4;
  int iVar5;
  int _c_00;
  undefined4 uVar6;
  size_t sVar7;
  int *piVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  long lVar22;
  Option *pOVar23;
  Mat *dst;
  int iVar24;
  uint uVar25;
  Option *opt_00;
  long lVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  int iVar30;
  uint uVar31;
  Option *opt_01;
  long lVar32;
  _func_int ***ppp_Var33;
  _func_int ***ppp_Var34;
  int iVar35;
  ulong uVar36;
  _func_int ***ppp_Var37;
  _func_int ***ppp_Var38;
  undefined1 (*pauVar39) [32];
  _func_int ***ppp_Var40;
  long lVar41;
  _func_int ***ppp_Var42;
  ulong uVar43;
  undefined1 (*pauVar44) [32];
  _func_int ***ppp_Var45;
  _func_int ***ppp_Var46;
  ulong uVar47;
  _func_int ***ppp_Var48;
  float *pfVar49;
  uint _w;
  void *pvVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  Mat local_1d8;
  long local_188;
  ulong local_180;
  int local_178;
  int local_174;
  Option *local_170;
  Mat *local_168;
  long local_160;
  undefined1 local_158 [40];
  int iStack_130;
  int iStack_12c;
  int iStack_128;
  undefined8 uStack_124;
  size_t local_118;
  undefined1 local_108 [64];
  size_t local_c8;
  Mat local_b8;
  Mat *local_70;
  Mat *local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  size_t local_48;
  Allocator *local_40;
  long local_38;
  
  _c = bottom_blob->c;
  uVar47 = (ulong)_c;
  sVar7 = bottom_blob->elemsize;
  iVar4 = bottom_blob->elempack;
  iVar5 = top_blob->w;
  iVar35 = top_blob->h;
  _c_00 = top_blob->c;
  opt_00 = (Option *)(long)_c_00;
  piVar8 = bottom_blob->refcount;
  local_b8.data = bottom_blob->data;
  local_b8.refcount._0_4_ = (int)bottom_blob->refcount;
  local_b8.refcount._4_4_ = (int)((ulong)bottom_blob->refcount >> 0x20);
  local_b8.allocator = bottom_blob->allocator;
  iVar30 = bottom_blob->h;
  iVar24 = bottom_blob->w;
  uVar16 = bottom_blob->dims;
  uVar17 = bottom_blob->w;
  local_b8.h = bottom_blob->h;
  local_b8.d = bottom_blob->d;
  local_b8.cstep = bottom_blob->cstep;
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + 1;
    UNLOCK();
    iVar24 = bottom_blob->w;
    iVar30 = bottom_blob->h;
  }
  iVar5 = (iVar5 + 5) / 6;
  local_178 = iVar5 * 6;
  iVar35 = (iVar35 + 5) / 6;
  local_174 = iVar35 * 6;
  local_168 = kernel_tm;
  local_b8.elemsize = sVar7;
  local_b8.elempack = iVar4;
  local_b8.dims = uVar16;
  local_b8.w = uVar17;
  local_b8.c = _c;
  local_70 = bias;
  local_68 = top_blob;
  copy_make_border(bottom_blob,&local_b8,0,(local_174 - iVar30) + 2,0,(local_178 - iVar24) + 2,0,0.0
                   ,opt);
  local_118 = 0;
  iVar35 = iVar35 * iVar5;
  local_158._0_8_ = (void *)0x0;
  local_158._8_4_ = 0;
  local_158._12_4_ = 0;
  local_158._16_4_ = 0;
  local_158._20_8_ = 0;
  local_158._32_8_ = (Allocator *)0x0;
  iStack_130 = 0;
  iStack_12c = 0;
  iStack_128 = 0;
  uStack_124._0_4_ = 0;
  uStack_124._4_4_ = 0;
  local_170 = opt;
  Mat::create((Mat *)local_158,iVar35,0x40,_c,sVar7,iVar4,opt->workspace_allocator);
  conv3x3s1_winograd63_transform_input_pack8_avx(&local_b8,(Mat *)local_158,opt_01);
  pOVar23 = local_170;
  piVar8 = (int *)CONCAT44(local_b8.refcount._4_4_,(int)local_b8.refcount);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_b8.cstep = 0;
  local_1d8.data = (Allocator *)0x0;
  local_1d8.refcount._0_4_ = 0;
  local_1d8.refcount._4_4_ = 0;
  local_b8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_1d8.elempack = 0;
  local_c8 = 0;
  _w = iVar35 * 8 >> 3;
  local_108._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  local_1d8.cstep = 0;
  uVar27 = _c * 8;
  uVar31 = (_w & 7) + (_w >> 3);
  local_1d8.elemsize._0_4_ = 0;
  uVar25 = uVar27;
  if ((int)_w < 8) {
    uVar31 = _w;
    uVar25 = _c;
  }
  local_1d8.elemsize._4_4_ = (int)local_1d8.refcount;
  local_1d8.allocator = (Allocator *)local_1d8.data;
  local_1d8.dims = (int)local_1d8.refcount;
  local_1d8.w = local_1d8.refcount._4_4_;
  local_1d8.h = (int)local_1d8.elemsize;
  local_1d8.d = (int)local_1d8.refcount;
  local_1d8.c = local_1d8.elempack;
  local_108._0_8_ = local_1d8.data;
  local_108._8_4_ = (int)local_1d8.refcount;
  local_108._12_4_ = local_1d8.refcount._4_4_;
  local_108._16_8_ = local_b8.elemsize;
  local_108._24_4_ = local_1d8.elempack;
  local_108._32_8_ = local_1d8.data;
  local_108._40_4_ = (int)local_1d8.refcount;
  local_108._44_4_ = local_1d8.refcount._4_4_;
  local_b8.data = local_1d8.data;
  local_b8.refcount._0_4_ = (int)local_1d8.refcount;
  local_b8.refcount._4_4_ = local_1d8.refcount._4_4_;
  local_b8.elempack = local_1d8.elempack;
  local_b8.allocator = (Allocator *)local_1d8.data;
  local_b8.dims = (int)local_1d8.refcount;
  local_b8.w = local_1d8.elempack;
  local_b8._48_8_ = local_b8.elemsize;
  local_b8.c = local_1d8.elempack;
  Mat::create(&local_1d8,uVar25,uVar31,0x40,sVar7,iVar4,pOVar23->workspace_allocator);
  lVar26 = (long)(int)_w;
  lVar28 = 0;
  do {
    lVar22 = CONCAT44(local_1d8.elemsize._4_4_,(int)local_1d8.elemsize);
    lVar32 = local_1d8.cstep * lVar28 * lVar22;
    uVar43 = 0;
    if (7 < (int)_w) {
      uVar29 = 0;
      do {
        if (0 < (int)_c) {
          pauVar44 = (undefined1 (*) [32])
                     ((ulong)((_w * (int)lVar28 + (int)uVar29) * 8) * 4 + local_158._0_8_);
          pauVar39 = (undefined1 (*) [32])
                     ((long)(_func_int ***)local_1d8.data +
                     (uVar29 >> 3) * lVar22 * local_1d8.w + lVar32);
          uVar31 = _c;
          do {
            auVar52 = vunpcklps_avx(*pauVar44,pauVar44[1]);
            auVar57 = vunpckhps_avx(*pauVar44,pauVar44[1]);
            auVar68 = vunpcklps_avx(pauVar44[2],pauVar44[3]);
            auVar59 = vunpckhps_avx(pauVar44[2],pauVar44[3]);
            auVar53 = vunpcklps_avx(pauVar44[4],pauVar44[5]);
            auVar61 = vunpckhps_avx(pauVar44[4],pauVar44[5]);
            auVar67 = vunpcklps_avx(pauVar44[6],pauVar44[7]);
            auVar63 = vunpckhps_avx(pauVar44[6],pauVar44[7]);
            auVar65 = vunpcklpd_avx(auVar52,auVar68);
            auVar52 = vunpckhpd_avx(auVar52,auVar68);
            auVar68 = vunpcklpd_avx(auVar57,auVar59);
            auVar57 = vunpckhpd_avx(auVar57,auVar59);
            auVar70 = vunpcklpd_avx(auVar53,auVar67);
            auVar59 = vunpckhpd_avx(auVar53,auVar67);
            auVar53 = vunpcklpd_avx(auVar61,auVar63);
            auVar61 = vunpckhpd_avx(auVar61,auVar63);
            auVar67._16_16_ = auVar70._0_16_;
            auVar67._0_16_ = auVar65._0_16_;
            auVar72._16_16_ = auVar59._0_16_;
            auVar72._0_16_ = auVar52._0_16_;
            auVar73._16_16_ = auVar53._0_16_;
            auVar73._0_16_ = auVar68._0_16_;
            auVar74._16_16_ = auVar61._0_16_;
            auVar74._0_16_ = auVar57._0_16_;
            auVar63 = vperm2f128_avx(auVar65,auVar70,0x31);
            auVar52 = vperm2f128_avx(auVar52,auVar59,0x31);
            auVar59 = vperm2f128_avx(auVar68,auVar53,0x31);
            auVar57 = vperm2f128_avx(auVar57,auVar61,0x31);
            *pauVar39 = auVar67;
            pauVar39[1] = auVar72;
            pauVar39[2] = auVar73;
            pauVar39[3] = auVar74;
            pauVar39[4] = auVar63;
            pauVar39[5] = auVar52;
            pauVar39[6] = auVar59;
            pauVar39[7] = auVar57;
            pauVar44 = pauVar44 + local_118;
            pauVar39 = pauVar39 + 8;
            uVar31 = uVar31 - 1;
          } while (uVar31 != 0);
        }
        uVar43 = uVar29 + 8;
        lVar41 = uVar29 + 0xf;
        uVar29 = uVar43;
      } while (lVar41 < lVar26);
    }
    if ((int)uVar43 < (int)_w) {
      uVar43 = uVar43 & 0xffffffff;
      do {
        if (0 < (int)_c) {
          pauVar39 = (undefined1 (*) [32])((uVar43 + lVar28 * lVar26) * 0x20 + local_158._0_8_);
          pauVar44 = (undefined1 (*) [32])
                     ((long)(_func_int ***)local_1d8.data +
                     (ulong)(((uint)uVar43 & 7) + ((uint)(uVar43 >> 3) & 0x1fffffff)) *
                     lVar22 * local_1d8.w + lVar32);
          uVar31 = _c;
          do {
            *pauVar44 = *pauVar39;
            pauVar44 = pauVar44 + 1;
            pauVar39 = pauVar39 + local_118;
            uVar31 = uVar31 - 1;
          } while (uVar31 != 0);
        }
        uVar43 = uVar43 + 1;
      } while (uVar43 != _w);
    }
    lVar28 = lVar28 + 1;
  } while (lVar28 != 0x40);
  piVar8 = (int *)CONCAT44(local_158._12_4_,local_158._8_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if ((Allocator *)local_158._32_8_ == (Allocator *)0x0) {
        if ((void *)local_158._0_8_ != (void *)0x0) {
          free((void *)local_158._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_158._32_8_)[3])();
      }
    }
  }
  local_118 = 0;
  local_158._0_8_ = (Allocator *)0x0;
  local_158._8_4_ = 0;
  local_158._12_4_ = 0;
  local_158._16_4_ = 0;
  local_158._20_8_ = 0;
  iStack_12c = 0;
  local_158._32_8_ = local_158._0_8_;
  iStack_130 = local_158._8_4_;
  iStack_128 = local_158._16_4_;
  uStack_124 = local_158._20_8_;
  Mat::create((Mat *)local_108,_w,0x40,_c_00,4,1,pOVar23->workspace_allocator);
  dst = local_68;
  pOVar23 = local_170;
  iVar4 = local_174;
  if (0 < _c_00 >> 3) {
    uVar31 = 1;
    if (1 < (int)uVar27) {
      uVar31 = uVar27;
    }
    local_60 = (ulong)(uint)(_c_00 >> 3);
    uVar43 = 0;
    do {
      local_58 = uVar43;
      ppp_Var33 = (_func_int ***)
                  ((long)(_func_int ***)local_108._0_8_ + local_58 * 8 * local_c8 * local_108._16_8_
                  );
      ppp_Var37 = (_func_int ***)
                  ((long)(_func_int ***)local_108._0_8_ +
                  (local_58 * 8 + 1) * local_c8 * local_108._16_8_);
      ppp_Var38 = (_func_int ***)
                  ((long)(_func_int ***)local_108._0_8_ +
                  (local_58 * 8 + 2) * local_c8 * local_108._16_8_);
      ppp_Var40 = (_func_int ***)
                  ((long)(_func_int ***)local_108._0_8_ +
                  (local_58 * 8 + 3) * local_c8 * local_108._16_8_);
      ppp_Var42 = (_func_int ***)
                  ((long)(_func_int ***)local_108._0_8_ +
                  (local_58 * 8 + 4) * local_c8 * local_108._16_8_);
      ppp_Var45 = (_func_int ***)
                  ((long)(_func_int ***)local_108._0_8_ +
                  (local_58 * 8 + 5) * local_c8 * local_108._16_8_);
      ppp_Var34 = (_func_int ***)
                  ((long)(_func_int ***)local_108._0_8_ +
                  (local_58 * 8 + 6) * local_c8 * local_108._16_8_);
      ppp_Var46 = (_func_int ***)
                  ((long)(_func_int ***)local_108._0_8_ +
                  (local_58 * 8 + 7) * local_c8 * local_108._16_8_);
      local_50 = (long)local_168->w * local_168->elemsize;
      pvVar50 = (void *)(local_168->elemsize * local_168->cstep * local_58 + (long)local_168->data);
      lVar28 = 0;
      do {
        local_160 = lVar28;
        uVar43 = 0;
        local_188 = (long)local_1d8.w;
        local_38 = CONCAT44(local_1d8.elemsize._4_4_,(int)local_1d8.elemsize);
        local_40 = (Allocator *)local_1d8.data;
        local_48 = local_1d8.cstep;
        if (7 < (int)_w) {
          ppp_Var48 = (_func_int ***)
                      ((long)(_func_int ***)local_1d8.data + local_1d8.cstep * local_38 * local_160)
          ;
          uVar29 = 0;
          do {
            if ((int)_c < 1) {
              auVar70 = SUB6432(ZEXT864(0),0);
              auVar68 = SUB6432(ZEXT864(0),0);
              auVar65 = SUB6432(ZEXT864(0),0);
              auVar63 = SUB6432(ZEXT864(0),0);
              auVar61 = SUB6432(ZEXT864(0),0);
              auVar59 = SUB6432(ZEXT864(0),0);
              auVar57 = SUB6432(ZEXT864(0),0);
              auVar52 = SUB6432(ZEXT864(0),0);
            }
            else {
              auVar56 = ZEXT864(0);
              lVar28 = 0;
              auVar58 = ZEXT864(0);
              auVar60 = ZEXT864(0);
              auVar62 = ZEXT864(0);
              auVar64 = ZEXT864(0);
              auVar66 = ZEXT864(0);
              auVar69 = ZEXT864(0);
              auVar71 = ZEXT864(0);
              uVar25 = uVar31;
              do {
                pfVar49 = (float *)((long)ppp_Var48 + lVar28);
                fVar9 = *pfVar49;
                fVar10 = pfVar49[1];
                fVar11 = pfVar49[2];
                fVar12 = pfVar49[3];
                fVar13 = pfVar49[4];
                fVar14 = pfVar49[5];
                fVar15 = pfVar49[6];
                fVar2 = *(float *)((long)pvVar50 + lVar28);
                fVar3 = *(float *)((long)pvVar50 + lVar28 + 4);
                auVar70._0_4_ = fVar2 * fVar9 + auVar71._0_4_;
                auVar70._4_4_ = fVar2 * fVar10 + auVar71._4_4_;
                auVar70._8_4_ = fVar2 * fVar11 + auVar71._8_4_;
                auVar70._12_4_ = fVar2 * fVar12 + auVar71._12_4_;
                auVar70._16_4_ = fVar2 * fVar13 + auVar71._16_4_;
                auVar70._20_4_ = fVar2 * fVar14 + auVar71._20_4_;
                auVar70._24_4_ = fVar2 * fVar15 + auVar71._24_4_;
                auVar70._28_4_ = fVar2 + auVar71._28_4_;
                auVar71 = ZEXT3264(auVar70);
                auVar68._0_4_ = fVar3 * fVar9 + auVar69._0_4_;
                auVar68._4_4_ = fVar3 * fVar10 + auVar69._4_4_;
                auVar68._8_4_ = fVar3 * fVar11 + auVar69._8_4_;
                auVar68._12_4_ = fVar3 * fVar12 + auVar69._12_4_;
                auVar68._16_4_ = fVar3 * fVar13 + auVar69._16_4_;
                auVar68._20_4_ = fVar3 * fVar14 + auVar69._20_4_;
                auVar68._24_4_ = fVar3 * fVar15 + auVar69._24_4_;
                auVar68._28_4_ = fVar2 + auVar69._28_4_;
                auVar69 = ZEXT3264(auVar68);
                fVar2 = *(float *)((long)pvVar50 + lVar28 + 8);
                fVar3 = *(float *)((long)pvVar50 + lVar28 + 0xc);
                auVar65._0_4_ = fVar2 * fVar9 + auVar66._0_4_;
                auVar65._4_4_ = fVar2 * fVar10 + auVar66._4_4_;
                auVar65._8_4_ = fVar2 * fVar11 + auVar66._8_4_;
                auVar65._12_4_ = fVar2 * fVar12 + auVar66._12_4_;
                auVar65._16_4_ = fVar2 * fVar13 + auVar66._16_4_;
                auVar65._20_4_ = fVar2 * fVar14 + auVar66._20_4_;
                auVar65._24_4_ = fVar2 * fVar15 + auVar66._24_4_;
                auVar65._28_4_ = fVar2 + auVar66._28_4_;
                auVar66 = ZEXT3264(auVar65);
                auVar63._0_4_ = fVar3 * fVar9 + auVar64._0_4_;
                auVar63._4_4_ = fVar3 * fVar10 + auVar64._4_4_;
                auVar63._8_4_ = fVar3 * fVar11 + auVar64._8_4_;
                auVar63._12_4_ = fVar3 * fVar12 + auVar64._12_4_;
                auVar63._16_4_ = fVar3 * fVar13 + auVar64._16_4_;
                auVar63._20_4_ = fVar3 * fVar14 + auVar64._20_4_;
                auVar63._24_4_ = fVar3 * fVar15 + auVar64._24_4_;
                auVar63._28_4_ = fVar2 + auVar64._28_4_;
                auVar64 = ZEXT3264(auVar63);
                fVar2 = *(float *)((long)pvVar50 + lVar28 + 0x10);
                fVar3 = *(float *)((long)pvVar50 + lVar28 + 0x14);
                auVar61._0_4_ = fVar2 * fVar9 + auVar62._0_4_;
                auVar61._4_4_ = fVar2 * fVar10 + auVar62._4_4_;
                auVar61._8_4_ = fVar2 * fVar11 + auVar62._8_4_;
                auVar61._12_4_ = fVar2 * fVar12 + auVar62._12_4_;
                auVar61._16_4_ = fVar2 * fVar13 + auVar62._16_4_;
                auVar61._20_4_ = fVar2 * fVar14 + auVar62._20_4_;
                auVar61._24_4_ = fVar2 * fVar15 + auVar62._24_4_;
                auVar61._28_4_ = fVar2 + auVar62._28_4_;
                auVar62 = ZEXT3264(auVar61);
                auVar59._0_4_ = fVar3 * fVar9 + auVar60._0_4_;
                auVar59._4_4_ = fVar3 * fVar10 + auVar60._4_4_;
                auVar59._8_4_ = fVar3 * fVar11 + auVar60._8_4_;
                auVar59._12_4_ = fVar3 * fVar12 + auVar60._12_4_;
                auVar59._16_4_ = fVar3 * fVar13 + auVar60._16_4_;
                auVar59._20_4_ = fVar3 * fVar14 + auVar60._20_4_;
                auVar59._24_4_ = fVar3 * fVar15 + auVar60._24_4_;
                auVar59._28_4_ = fVar2 + auVar60._28_4_;
                auVar60 = ZEXT3264(auVar59);
                fVar2 = *(float *)((long)pvVar50 + lVar28 + 0x18);
                fVar3 = *(float *)((long)pvVar50 + lVar28 + 0x1c);
                auVar57._0_4_ = fVar2 * fVar9 + auVar58._0_4_;
                auVar57._4_4_ = fVar2 * fVar10 + auVar58._4_4_;
                auVar57._8_4_ = fVar2 * fVar11 + auVar58._8_4_;
                auVar57._12_4_ = fVar2 * fVar12 + auVar58._12_4_;
                auVar57._16_4_ = fVar2 * fVar13 + auVar58._16_4_;
                auVar57._20_4_ = fVar2 * fVar14 + auVar58._20_4_;
                auVar57._24_4_ = fVar2 * fVar15 + auVar58._24_4_;
                auVar57._28_4_ = fVar2 + auVar58._28_4_;
                auVar58 = ZEXT3264(auVar57);
                auVar52._0_4_ = fVar3 * fVar9 + auVar56._0_4_;
                auVar52._4_4_ = fVar3 * fVar10 + auVar56._4_4_;
                auVar52._8_4_ = fVar3 * fVar11 + auVar56._8_4_;
                auVar52._12_4_ = fVar3 * fVar12 + auVar56._12_4_;
                auVar52._16_4_ = fVar3 * fVar13 + auVar56._16_4_;
                auVar52._20_4_ = fVar3 * fVar14 + auVar56._20_4_;
                auVar52._24_4_ = fVar3 * fVar15 + auVar56._24_4_;
                auVar52._28_4_ = pfVar49[7] + auVar56._28_4_;
                auVar56 = ZEXT3264(auVar52);
                lVar28 = lVar28 + 0x20;
                uVar25 = uVar25 - 1;
              } while (uVar25 != 0);
            }
            *(undefined1 (*) [32])ppp_Var33 = auVar70;
            *(undefined1 (*) [32])ppp_Var37 = auVar68;
            *(undefined1 (*) [32])ppp_Var38 = auVar65;
            *(undefined1 (*) [32])ppp_Var40 = auVar63;
            *(undefined1 (*) [32])ppp_Var42 = auVar61;
            *(undefined1 (*) [32])ppp_Var45 = auVar59;
            *(undefined1 (*) [32])ppp_Var34 = auVar57;
            *(undefined1 (*) [32])ppp_Var46 = auVar52;
            ppp_Var33 = ppp_Var33 + 4;
            ppp_Var37 = ppp_Var37 + 4;
            ppp_Var38 = ppp_Var38 + 4;
            ppp_Var40 = ppp_Var40 + 4;
            ppp_Var42 = ppp_Var42 + 4;
            ppp_Var45 = ppp_Var45 + 4;
            ppp_Var34 = ppp_Var34 + 4;
            ppp_Var46 = ppp_Var46 + 4;
            uVar43 = uVar29 + 8;
            lVar28 = uVar29 + 0xf;
            ppp_Var48 = (_func_int ***)((long)ppp_Var48 + local_38 * local_188);
            uVar29 = uVar43;
          } while (lVar28 < lVar26);
        }
        if ((int)uVar43 < (int)_w) {
          do {
            if ((int)_c < 1) {
              auVar53 = ZEXT832(0);
            }
            else {
              auVar56 = ZEXT864(0);
              lVar28 = 0;
              uVar25 = uVar31;
              do {
                fVar2 = *(float *)((long)(_func_int ***)local_1d8.data +
                                  lVar28 + ((ulong)(((uint)uVar43 & 7) +
                                                   ((uint)(uVar43 >> 3) & 0x1fffffff)) * local_188 +
                                           local_1d8.cstep * local_160) * local_38);
                pfVar49 = (float *)((long)pvVar50 + lVar28 * 8);
                auVar53._0_4_ = fVar2 * *pfVar49 + auVar56._0_4_;
                auVar53._4_4_ = fVar2 * pfVar49[1] + auVar56._4_4_;
                auVar53._8_4_ = fVar2 * pfVar49[2] + auVar56._8_4_;
                auVar53._12_4_ = fVar2 * pfVar49[3] + auVar56._12_4_;
                auVar53._16_4_ = fVar2 * pfVar49[4] + auVar56._16_4_;
                auVar53._20_4_ = fVar2 * pfVar49[5] + auVar56._20_4_;
                auVar53._24_4_ = fVar2 * pfVar49[6] + auVar56._24_4_;
                auVar53._28_4_ = fVar2 + auVar56._28_4_;
                auVar56 = ZEXT3264(auVar53);
                lVar28 = lVar28 + 4;
                uVar25 = uVar25 - 1;
              } while (uVar25 != 0);
            }
            *(int *)ppp_Var33 = auVar53._0_4_;
            auVar51 = auVar53._0_16_;
            uVar6 = vextractps_avx(auVar51,1);
            *(undefined4 *)ppp_Var37 = uVar6;
            uVar6 = vextractps_avx(auVar51,2);
            *(undefined4 *)ppp_Var38 = uVar6;
            uVar6 = vextractps_avx(auVar51,3);
            *(undefined4 *)ppp_Var40 = uVar6;
            auVar51 = auVar53._16_16_;
            *(int *)ppp_Var42 = auVar53._16_4_;
            uVar6 = vextractps_avx(auVar51,1);
            *(undefined4 *)ppp_Var45 = uVar6;
            uVar6 = vextractps_avx(auVar51,2);
            *(undefined4 *)ppp_Var34 = uVar6;
            uVar6 = vextractps_avx(auVar51,3);
            *(undefined4 *)ppp_Var46 = uVar6;
            ppp_Var33 = (_func_int ***)((long)ppp_Var33 + 4);
            ppp_Var37 = (_func_int ***)((long)ppp_Var37 + 4);
            ppp_Var38 = (_func_int ***)((long)ppp_Var38 + 4);
            ppp_Var40 = (_func_int ***)((long)ppp_Var40 + 4);
            ppp_Var42 = (_func_int ***)((long)ppp_Var42 + 4);
            ppp_Var45 = (_func_int ***)((long)ppp_Var45 + 4);
            ppp_Var34 = (_func_int ***)((long)ppp_Var34 + 4);
            ppp_Var46 = (_func_int ***)((long)ppp_Var46 + 4);
            uVar25 = (uint)uVar43 + 1;
            uVar43 = (ulong)uVar25;
          } while (uVar25 != _w);
        }
        pvVar50 = (void *)((long)pvVar50 + local_50);
        lVar28 = local_160 + 1;
      } while (local_160 + 1 != 0x40);
      uVar43 = local_58 + 1;
    } while (local_58 + 1 != local_60);
  }
  uVar43 = (ulong)opt_00 & 0xfffffffffffffff8;
  if ((int)uVar43 != _c_00) {
    uVar31 = 1;
    if (1 < (int)uVar27) {
      uVar31 = uVar27;
    }
    do {
      ppp_Var33 = (_func_int ***)
                  ((long)(_func_int ***)local_108._0_8_ + local_c8 * uVar43 * local_108._16_8_);
      uVar25 = (uint)uVar43;
      uVar27 = uVar25 + 7;
      if (-1 < (int)uVar25) {
        uVar27 = uVar25;
      }
      iVar5 = local_168->w;
      sVar7 = local_168->elemsize;
      pvVar50 = (void *)((long)(int)(((int)uVar27 >> 3) + (uVar25 - (uVar27 & 0xfffffff8))) *
                         local_168->cstep * sVar7 + (long)local_168->data);
      lVar28 = 0;
      do {
        lVar22 = CONCAT44(local_1d8.elemsize._4_4_,(int)local_1d8.elemsize);
        uVar29 = 0;
        if (7 < (int)_w) {
          uVar36 = 0;
          do {
            if ((int)_c < 1) {
              auVar54 = SUB6432(ZEXT864(0),0);
            }
            else {
              pfVar49 = (float *)((long)(_func_int ***)local_1d8.data +
                                 (uVar36 >> 3) * lVar22 * local_1d8.w +
                                 local_1d8.cstep * lVar28 * lVar22);
              auVar56 = ZEXT864(0);
              lVar32 = 0;
              do {
                fVar2 = *(float *)((long)pvVar50 + lVar32 * 4);
                auVar54._0_4_ = fVar2 * *pfVar49 + auVar56._0_4_;
                auVar54._4_4_ = fVar2 * pfVar49[1] + auVar56._4_4_;
                auVar54._8_4_ = fVar2 * pfVar49[2] + auVar56._8_4_;
                auVar54._12_4_ = fVar2 * pfVar49[3] + auVar56._12_4_;
                auVar54._16_4_ = fVar2 * pfVar49[4] + auVar56._16_4_;
                auVar54._20_4_ = fVar2 * pfVar49[5] + auVar56._20_4_;
                auVar54._24_4_ = fVar2 * pfVar49[6] + auVar56._24_4_;
                auVar54._28_4_ = fVar2 + auVar56._28_4_;
                auVar56 = ZEXT3264(auVar54);
                pfVar49 = pfVar49 + 8;
                lVar32 = lVar32 + 1;
              } while (uVar31 != (uint)lVar32);
            }
            *(undefined1 (*) [32])ppp_Var33 = auVar54;
            ppp_Var33 = ppp_Var33 + 4;
            uVar29 = uVar36 + 8;
            lVar32 = uVar36 + 0xf;
            uVar36 = uVar29;
          } while (lVar32 < lVar26);
        }
        if ((int)uVar29 < (int)_w) {
          do {
            if ((int)_c < 1) {
              auVar55 = ZEXT832(0);
            }
            else {
              auVar56 = ZEXT864(0);
              lVar32 = 0;
              uVar36 = uVar47;
              do {
                pfVar49 = (float *)((long)pvVar50 + lVar32);
                pfVar1 = (float *)((long)(_func_int ***)local_1d8.data +
                                  lVar32 + ((ulong)(((uint)uVar29 & 7) +
                                                   ((uint)(uVar29 >> 3) & 0x1fffffff)) *
                                            (long)local_1d8.w + local_1d8.cstep * lVar28) * lVar22);
                auVar55._0_4_ = *pfVar49 * *pfVar1 + auVar56._0_4_;
                auVar55._4_4_ = pfVar49[1] * pfVar1[1] + auVar56._4_4_;
                auVar55._8_4_ = pfVar49[2] * pfVar1[2] + auVar56._8_4_;
                auVar55._12_4_ = pfVar49[3] * pfVar1[3] + auVar56._12_4_;
                auVar55._16_4_ = pfVar49[4] * pfVar1[4] + auVar56._16_4_;
                auVar55._20_4_ = pfVar49[5] * pfVar1[5] + auVar56._20_4_;
                auVar55._24_4_ = pfVar49[6] * pfVar1[6] + auVar56._24_4_;
                auVar55._28_4_ = pfVar49[7] + auVar56._28_4_;
                auVar56 = ZEXT3264(auVar55);
                lVar32 = lVar32 + 0x20;
                uVar25 = (int)uVar36 - 1;
                uVar36 = (ulong)uVar25;
              } while (uVar25 != 0);
            }
            auVar51 = vhaddps_avx(auVar55._16_16_,auVar55._0_16_);
            auVar51 = vhaddps_avx(auVar51,auVar51);
            auVar51 = vhaddps_avx(auVar51,auVar51);
            *(int *)ppp_Var33 = auVar51._0_4_;
            ppp_Var33 = (_func_int ***)((long)ppp_Var33 + 4);
            uVar25 = (uint)uVar29 + 1;
            uVar29 = (ulong)uVar25;
          } while (uVar25 != _w);
        }
        lVar28 = lVar28 + 1;
        pvVar50 = (void *)((long)pvVar50 + (long)iVar5 * sVar7);
      } while (lVar28 != 0x40);
      uVar43 = uVar43 + 1;
    } while ((long)uVar43 < (long)opt_00);
  }
  piVar8 = (int *)CONCAT44(local_1d8.refcount._4_4_,(int)local_1d8.refcount);
  local_180 = uVar47;
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_1d8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_1d8.data != (Allocator *)0x0) {
          free(local_1d8.data);
        }
      }
      else {
        (*(local_1d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar8 = (int *)CONCAT44(local_158._12_4_,local_158._8_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if ((Allocator *)local_158._32_8_ == (Allocator *)0x0) {
        if ((Allocator *)local_158._0_8_ != (Allocator *)0x0) {
          free((void *)local_158._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_158._32_8_)[3])();
      }
    }
  }
  local_118 = 0;
  local_158._0_8_ = (void *)0x0;
  local_158._8_4_ = 0;
  local_158._12_4_ = 0;
  local_158._16_4_ = 0;
  local_158._20_8_ = 0;
  iStack_128 = 0;
  uStack_124._0_4_ = 0;
  uStack_124._4_4_ = 0;
  local_158._32_8_ = (Allocator *)0x0;
  iStack_130 = 0;
  iStack_12c = 0;
  local_1d8.cstep = 0;
  local_1d8.data = (void *)0x0;
  local_1d8.refcount._0_4_ = 0;
  local_1d8.refcount._4_4_ = 0;
  local_1d8.elemsize._0_4_ = 0;
  local_1d8.elemsize._4_4_ = 0;
  local_1d8.elempack = 0;
  local_1d8.allocator = (Allocator *)0x0;
  local_1d8.dims = 0;
  local_1d8.w = 0;
  local_1d8.h = 0;
  local_1d8.d = 0;
  local_1d8.c = 0;
  if ((local_178 == dst->w) && (iVar4 == dst->h)) {
    opt_00 = (Option *)(local_158 + 0x20);
    if (&local_1d8 != dst) {
      piVar8 = dst->refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      local_1d8.data = dst->data;
      local_1d8.refcount._0_4_ = (int)dst->refcount;
      local_1d8.refcount._4_4_ = (int)((ulong)dst->refcount >> 0x20);
      local_1d8.elemsize._0_4_ = (int)dst->elemsize;
      local_1d8.elemsize._4_4_ = (int)(dst->elemsize >> 0x20);
      local_1d8.elempack = dst->elempack;
      local_1d8.allocator = dst->allocator;
      uVar18 = dst->dims;
      uVar19 = dst->w;
      uVar20 = dst->h;
      uVar21 = dst->d;
      local_1d8.c = dst->c;
      local_1d8.cstep = dst->cstep;
      local_1d8.dims = uVar18;
      local_1d8.w = uVar19;
      local_1d8.h = uVar20;
      local_1d8.d = uVar21;
    }
  }
  else {
    Mat::create(&local_1d8,local_178,iVar4,_c_00,4,1,pOVar23->workspace_allocator);
  }
  conv3x3s1_winograd63_transform_output_sse
            ((Mat *)local_108,&local_1d8,(Mat *)local_70->data,opt_00);
  copy_cut_border(&local_1d8,dst,0,local_1d8.h - dst->h,0,local_1d8.w - dst->w,pOVar23);
  piVar8 = (int *)CONCAT44(local_1d8.refcount._4_4_,(int)local_1d8.refcount);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_1d8.allocator == (Allocator *)0x0) {
        if (local_1d8.data != (void *)0x0) {
          free(local_1d8.data);
        }
      }
      else {
        (*(local_1d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar8 = (int *)CONCAT44(local_108._12_4_,local_108._8_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if ((Allocator *)local_108._32_8_ == (Allocator *)0x0) {
        if ((Allocator *)local_108._0_8_ != (Allocator *)0x0) {
          free((void *)local_108._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_108._32_8_)[3])();
      }
    }
  }
  piVar8 = (int *)CONCAT44(local_158._12_4_,local_158._8_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if ((Allocator *)local_158._32_8_ == (Allocator *)0x0) {
        if ((void *)local_158._0_8_ != (void *)0x0) {
          free((void *)local_158._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_158._32_8_)[3])();
      }
    }
  }
  piVar8 = (int *)CONCAT44(local_b8.refcount._4_4_,(int)local_b8.refcount);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_b8.data != (Allocator *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_pack8to1_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 6n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 5) / 6 * 6;
    outh = (outh + 5) / 6 * 6;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 6;
        int h_tiles = outh / 6;
        const int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 64, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd63_transform_input_pack8_avx(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 6 * 8;
        int h_tm = outh / 6 * 8;

        const int tiles = h_tm / 8 * w_tm / 8;

        // permute
        //         bottom_blob_tm.create(tiles, 64, inch, elemsize, elempack, opt.workspace_allocator);
        Mat bottom_blob_tm2;
        if (tiles >= 8)
            bottom_blob_tm2.create(8 * inch, tiles / 8 + tiles % 8, 64, elemsize, elempack, opt.workspace_allocator);
        else // if (tiles >= 1)
            bottom_blob_tm2.create(1 * inch, tiles, 64, elemsize, elempack, opt.workspace_allocator);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int r = 0; r < 64; r++)
        {
            Mat tm2 = bottom_blob_tm2.channel(r);

            // tile
            int i = 0;
            for (; i + 7 < tiles; i += 8)
            {
                float* tmpptr = tm2.row(i / 8);

                const float* r0 = bottom_blob_tm;

                r0 += (r * tiles + i) * 8;

                for (int q = 0; q < inch; q++)
                {
                    // transpose 8x8
                    __m256 _r0 = _mm256_load_ps(r0);
                    __m256 _r1 = _mm256_load_ps(r0 + 8);
                    __m256 _r2 = _mm256_load_ps(r0 + 8 * 2);
                    __m256 _r3 = _mm256_load_ps(r0 + 8 * 3);
                    __m256 _r4 = _mm256_load_ps(r0 + 8 * 4);
                    __m256 _r5 = _mm256_load_ps(r0 + 8 * 5);
                    __m256 _r6 = _mm256_load_ps(r0 + 8 * 6);
                    __m256 _r7 = _mm256_load_ps(r0 + 8 * 7);

                    __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                    __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                    __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                    __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                    __m256 _tmp4 = _mm256_unpacklo_ps(_r4, _r5);
                    __m256 _tmp5 = _mm256_unpackhi_ps(_r4, _r5);
                    __m256 _tmp6 = _mm256_unpacklo_ps(_r6, _r7);
                    __m256 _tmp7 = _mm256_unpackhi_ps(_r6, _r7);
                    __m256 _tmp8 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmp9 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpa = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpb = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpc = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpd = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpe = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpf = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(3, 2, 3, 2));
                    _r0 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 2, 0, 0));
                    _r1 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 2, 0, 0));
                    _r2 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 2, 0, 0));
                    _r3 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 2, 0, 0));
                    _r4 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 3, 0, 1));
                    _r5 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 3, 0, 1));
                    _r6 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 3, 0, 1));
                    _r7 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 3, 0, 1));

                    _mm256_store_ps(tmpptr, _r0);
                    _mm256_store_ps(tmpptr + 8, _r1);
                    _mm256_store_ps(tmpptr + 8 * 2, _r2);
                    _mm256_store_ps(tmpptr + 8 * 3, _r3);
                    _mm256_store_ps(tmpptr + 8 * 4, _r4);
                    _mm256_store_ps(tmpptr + 8 * 5, _r5);
                    _mm256_store_ps(tmpptr + 8 * 6, _r6);
                    _mm256_store_ps(tmpptr + 8 * 7, _r7);

                    tmpptr += 64;
                    r0 += bottom_blob_tm.cstep * 8;
                }
            }
            for (; i < tiles; i++)
            {
                float* tmpptr = tm2.row(i / 8 + i % 8);

                const float* r0 = bottom_blob_tm;

                r0 += (r * tiles + i) * 8;

                for (int q = 0; q < inch; q++)
                {
                    __m256 _val = _mm256_load_ps(r0);
                    _mm256_store_ps(tmpptr, _val);

                    tmpptr += 8;
                    r0 += bottom_blob_tm.cstep * 8;
                }
            }
        }

        bottom_blob_tm = Mat();
        // permute end

        top_blob_tm.create(tiles, 64, outch, 4u, 1, opt.workspace_allocator);

        int nn_outch = outch >> 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int p = pp * 8;

            float* outptr0_tm = top_blob_tm.channel(p);
            float* outptr1_tm = top_blob_tm.channel(p + 1);
            float* outptr2_tm = top_blob_tm.channel(p + 2);
            float* outptr3_tm = top_blob_tm.channel(p + 3);
            float* outptr4_tm = top_blob_tm.channel(p + 4);
            float* outptr5_tm = top_blob_tm.channel(p + 5);
            float* outptr6_tm = top_blob_tm.channel(p + 6);
            float* outptr7_tm = top_blob_tm.channel(p + 7);

            const Mat kernel01_tm = kernel_tm.channel(p / 8);

            for (int r = 0; r < 64; r++)
            {
                const Mat bb2 = bottom_blob_tm2.channel(r);

                int i = 0;
                for (; i + 7 < tiles; i += 8)
                {
                    const float* r0 = bb2.row(i / 8);

                    const float* kptr = kernel01_tm.row(r);

                    int nn = inch * 8; // inch always > 0

                    __m256 _sum0 = _mm256_setzero_ps();
                    __m256 _sum1 = _mm256_setzero_ps();
                    __m256 _sum2 = _mm256_setzero_ps();
                    __m256 _sum3 = _mm256_setzero_ps();
                    __m256 _sum4 = _mm256_setzero_ps();
                    __m256 _sum5 = _mm256_setzero_ps();
                    __m256 _sum6 = _mm256_setzero_ps();
                    __m256 _sum7 = _mm256_setzero_ps();

                    for (int j = 0; j < nn; j++)
                    {
                        __m256 _val0 = _mm256_load_ps(r0);

                        __m256 _w0 = _mm256_broadcast_ss(kptr);
                        __m256 _w1 = _mm256_broadcast_ss(kptr + 1);
                        _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                        _sum1 = _mm256_comp_fmadd_ps(_val0, _w1, _sum1);
                        __m256 _w2 = _mm256_broadcast_ss(kptr + 2);
                        __m256 _w3 = _mm256_broadcast_ss(kptr + 3);
                        _sum2 = _mm256_comp_fmadd_ps(_val0, _w2, _sum2);
                        _sum3 = _mm256_comp_fmadd_ps(_val0, _w3, _sum3);
                        __m256 _w4 = _mm256_broadcast_ss(kptr + 4);
                        __m256 _w5 = _mm256_broadcast_ss(kptr + 5);
                        _sum4 = _mm256_comp_fmadd_ps(_val0, _w4, _sum4);
                        _sum5 = _mm256_comp_fmadd_ps(_val0, _w5, _sum5);
                        __m256 _w6 = _mm256_broadcast_ss(kptr + 6);
                        __m256 _w7 = _mm256_broadcast_ss(kptr + 7);
                        _sum6 = _mm256_comp_fmadd_ps(_val0, _w6, _sum6);
                        _sum7 = _mm256_comp_fmadd_ps(_val0, _w7, _sum7);

                        r0 += 8;
                        kptr += 8;
                    }

                    _mm256_storeu_ps(outptr0_tm, _sum0);
                    _mm256_storeu_ps(outptr1_tm, _sum1);
                    _mm256_storeu_ps(outptr2_tm, _sum2);
                    _mm256_storeu_ps(outptr3_tm, _sum3);
                    _mm256_storeu_ps(outptr4_tm, _sum4);
                    _mm256_storeu_ps(outptr5_tm, _sum5);
                    _mm256_storeu_ps(outptr6_tm, _sum6);
                    _mm256_storeu_ps(outptr7_tm, _sum7);

                    outptr0_tm += 8;
                    outptr1_tm += 8;
                    outptr2_tm += 8;
                    outptr3_tm += 8;
                    outptr4_tm += 8;
                    outptr5_tm += 8;
                    outptr6_tm += 8;
                    outptr7_tm += 8;
                }
                for (; i < tiles; i++)
                {
                    const float* r0 = bb2.row(i / 8 + i % 8);

                    const float* kptr = kernel01_tm.row(r);

                    int nn = inch * 8; // inch always > 0

                    __m256 _sum = _mm256_setzero_ps();

                    for (int j = 0; j < nn; j++)
                    {
                        __m256 _val0 = _mm256_broadcast_ss(r0);
                        __m256 _w0 = _mm256_load_ps(kptr);
                        _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);

                        r0 += 1;
                        kptr += 8;
                    }

                    float sum[8];
                    _mm256_storeu_ps(sum, _sum);

                    outptr0_tm[0] = sum[0];
                    outptr1_tm[0] = sum[1];
                    outptr2_tm[0] = sum[2];
                    outptr3_tm[0] = sum[3];
                    outptr4_tm[0] = sum[4];
                    outptr5_tm[0] = sum[5];
                    outptr6_tm[0] = sum[6];
                    outptr7_tm[0] = sum[7];

                    outptr0_tm += 1;
                    outptr1_tm += 1;
                    outptr2_tm += 1;
                    outptr3_tm += 1;
                    outptr4_tm += 1;
                    outptr5_tm += 1;
                    outptr6_tm += 1;
                    outptr7_tm += 1;
                }
            }
        }

        int remain_outch_start = nn_outch << 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = remain_outch_start; p < outch; p++)
        {
            float* outptr0_tm = top_blob_tm.channel(p);

            const Mat kernel0_tm = kernel_tm.channel(p / 8 + p % 8);

            for (int r = 0; r < 64; r++)
            {
                const Mat bb2 = bottom_blob_tm2.channel(r);

                int i = 0;
                for (; i + 7 < tiles; i += 8)
                {
                    const float* r0 = bb2.row(i / 8);

                    const float* kptr = kernel0_tm.row(r);

                    int nn = inch * 8; // inch always > 0

                    __m256 _sum0 = _mm256_setzero_ps();

                    for (int j = 0; j < nn; j++)
                    {
                        __m256 _val0 = _mm256_load_ps(r0);
                        __m256 _w0 = _mm256_broadcast_ss(kptr);
                        _sum0 = _mm256_comp_fmadd_ps(_w0, _val0, _sum0);

                        r0 += 8;
                        kptr += 1;
                    }

                    _mm256_storeu_ps(outptr0_tm, _sum0);
                    outptr0_tm += 8;
                }
                for (; i < tiles; i++)
                {
                    const float* r0 = bb2.row(i / 8 + i % 8);

                    const float* kptr = kernel0_tm.row(r);

                    __m256 _sum0 = _mm256_setzero_ps();

                    for (int q = 0; q < inch; q++)
                    {
                        __m256 _val0 = _mm256_load_ps(r0);
                        __m256 _w0 = _mm256_load_ps(kptr);
                        _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);

                        r0 += 8;
                        kptr += 8;
                    }

                    float sum0 = _mm256_reduce_add_ps(_sum0);

                    outptr0_tm[0] = sum0;
                    outptr0_tm++;
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, 4u, 1, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd63_transform_output_sse(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}